

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t __thiscall icu_63::UnicodeSet::hashCode(UnicodeSet *this)

{
  int local_18;
  int local_14;
  int32_t i;
  uint32_t result;
  UnicodeSet *this_local;
  
  local_14 = this->len;
  for (local_18 = 0; local_18 < this->len; local_18 = local_18 + 1) {
    local_14 = this->list[local_18] + local_14 * 0xf4243;
  }
  return local_14;
}

Assistant:

int32_t UnicodeSet::hashCode(void) const {
    uint32_t result = static_cast<uint32_t>(len);
    for (int32_t i = 0; i < len; ++i) {
        result *= 1000003u;
        result += list[i];
    }
    return static_cast<int32_t>(result);
}